

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O0

int cinatra::detail::phr_parse_request
              (char *buf_start,size_t len,char **method,size_t *method_len,char **path,
              size_t *path_len,int *minor_version,http_header *headers,size_t *num_headers,
              size_t last_len,bool *has_connection,bool *has_close,bool *has_upgrade,bool *has_query
              )

{
  char *buf_end_00;
  char *pcVar1;
  char *pcVar2;
  http_header *in_RCX;
  size_t *in_RDX;
  bool *unaff_RBX;
  size_t in_RSI;
  int *in_RDI;
  int *in_R8;
  undefined8 *in_R9;
  bool *unaff_R12;
  bool *unaff_R13;
  undefined4 *in_stack_00000008;
  undefined8 *in_stack_00000018;
  size_t in_stack_00000020;
  size_t *in_stack_00000038;
  char **in_stack_00000040;
  int r;
  size_t max_headers;
  char *buf_end;
  char *buf;
  size_t *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  
  buf_end_00 = (char *)((long)in_RDI + in_RSI);
  pcVar2 = (char *)*in_stack_00000018;
  *in_RDX = 0;
  (in_RCX->name)._M_len = 0;
  in_R8[0] = 0;
  in_R8[1] = 0;
  *in_R9 = 0;
  *in_stack_00000008 = 0xffffffff;
  *in_stack_00000018 = 0;
  if (((in_stack_00000020 == 0) ||
      (pcVar1 = is_complete((char *)in_RDI,buf_end_00,in_stack_00000020,
                            (int *)&stack0xffffffffffffff7c), pcVar1 != (char *)0x0)) &&
     (pcVar2 = parse_request(buf_end_00,pcVar2,
                             (char **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                             in_stack_ffffffffffffff70,in_stack_00000040,in_stack_00000038,in_R8,
                             in_RCX,in_RDX,in_RSI,in_RDI,
                             (bool *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             unaff_RBX,unaff_R12,unaff_R13), pcVar2 != (char *)0x0)) {
    in_stack_ffffffffffffff7c = ((int)pcVar2 - (int)in_RDI) - (int)in_stack_00000020;
  }
  return in_stack_ffffffffffffff7c;
}

Assistant:

inline int phr_parse_request(const char *buf_start, size_t len,
                             const char **method, size_t *method_len,
                             const char **path, size_t *path_len,
                             int *minor_version, http_header *headers,
                             size_t *num_headers, size_t last_len,
                             bool &has_connection, bool &has_close,
                             bool &has_upgrade, bool &has_query) {
  const char *buf = buf_start, *buf_end = buf_start + len;
  size_t max_headers = *num_headers;
  int r;

  *method = NULL;
  *method_len = 0;
  *path = NULL;
  *path_len = 0;
  *minor_version = -1;
  *num_headers = 0;

  /* if last_len != 0, check if the request is complete (a fast countermeasure
  againt slowloris */
  if (last_len != 0 && is_complete(buf, buf_end, last_len, &r) == NULL) {
    return r;
  }

  if ((buf = parse_request(buf + last_len, buf_end, method, method_len, path,
                           path_len, minor_version, headers, num_headers,
                           max_headers, &r, has_connection, has_close,
                           has_upgrade, has_query)) == NULL) {
    return r;
  }

  return (int)(buf - buf_start - last_len);
}